

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker.cc
# Opt level: O2

vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_> *
__thiscall
google::protobuf::compiler::cpp::anon_unknown_0::GenerateTrackerCalls
          (vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
           *__return_storage_ptr__,anon_unknown_0 *this,Options *opts,Descriptor *message,
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *alt_annotation,
          Span<const_google::protobuf::compiler::cpp::(anonymous_namespace)::Call> calls)

{
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  key_arg<std::basic_string_view<char>_> *pkVar4;
  Descriptor *b;
  AlphaNum *in_R9;
  AlphaNum *d;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg;
  char *pcVar5;
  string_view format;
  string_view format_00;
  size_t sStack_2c0;
  string call_str;
  string_view local_260;
  string local_230;
  AlphaNum local_210;
  string local_1e0;
  string_view local_1c0;
  string local_108;
  Sub local_e8;
  
  b = message;
  d = in_R9;
  bVar2 = HasTracker((Descriptor *)opts,(Options *)this);
  (__return_storage_ptr__->
  super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pkVar4 = (key_arg<std::basic_string_view<char>_> *)((long)in_R9 * 0x60 + (long)alt_annotation);
  do {
    if ((key_arg<std::basic_string_view<char>_> *)alt_annotation == pkVar4) {
      return __return_storage_ptr__;
    }
    call_str._M_dataplus._M_p = (pointer)&call_str.field_2;
    call_str._M_string_length = 0;
    call_str.field_2._M_local_buf[0] = '\0';
    if ((bVar2) &&
       (*(char *)&((key_arg<std::basic_string_view<char>_> *)((long)alt_annotation + 0x50))->_M_str
        == '\0')) {
      bVar3 = absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
              ::contains<std::basic_string_view<char,std::char_traits<char>>>
                        ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
                          *)(this + 0x98),(key_arg<std::basic_string_view<char>_> *)alt_annotation);
      if (bVar3) goto LAB_002165d9;
      local_1c0._M_str = "Impl_::_tracker_";
      local_1c0._M_len = 0x10;
      local_e8.key_._M_dataplus._M_p =
           (pointer)((key_arg<std::basic_string_view<char>_> *)((long)alt_annotation + 0x10))->
                    _M_len;
      local_e8.key_._M_string_length =
           (size_type)
           ((key_arg<std::basic_string_view<char>_> *)((long)alt_annotation + 0x10))->_M_str;
      format._M_str = "$0.$1";
      format._M_len = 5;
      absl::lts_20250127::SubstituteAndAppend(&call_str,format,(Arg *)&local_1c0,(Arg *)&local_e8);
      if (*(char *)((long)&((key_arg<std::basic_string_view<char>_> *)((long)alt_annotation + 0x20))
                           ->_M_len + 4) == '\x01') {
        absl::lts_20250127::substitute_internal::Arg::Arg
                  ((Arg *)&local_1c0,
                   (int)((key_arg<std::basic_string_view<char>_> *)((long)alt_annotation + 0x20))->
                        _M_len);
        format_00._M_str = "<$0>";
        format_00._M_len = 4;
        absl::lts_20250127::SubstituteAndAppend(&call_str,format_00,(Arg *)&local_1c0);
      }
      local_1c0 = absl::lts_20250127::NullSafeStringView("(");
      absl::lts_20250127::StrAppend(&call_str,(AlphaNum *)&local_1c0);
      if (*(char *)&((key_arg<std::basic_string_view<char>_> *)((long)alt_annotation + 0x30))->
                    _M_str == '\x01') {
        local_1c0 = *(string_view *)
                     &((key_arg<std::basic_string_view<char>_> *)((long)alt_annotation + 0x20))->
                      _M_str;
        absl::lts_20250127::StrAppend(&call_str,(AlphaNum *)&local_1c0);
        sStack_2c0 = 2;
        b = (Descriptor *)0x501b6e;
      }
      else {
        sStack_2c0 = 0;
        b = (Descriptor *)0x4168cc;
      }
      pcVar1 = ((key_arg<std::basic_string_view<char>_> *)((long)alt_annotation + 0x40))->_M_str;
      for (pcVar5 = (char *)((key_arg<std::basic_string_view<char>_> *)((long)alt_annotation + 0x40)
                            )->_M_len; pcVar5 != pcVar1; pcVar5 = pcVar5 + 0x20) {
        local_1c0._M_str = (char *)b;
        local_1c0._M_len = sStack_2c0;
        local_e8.key_._M_string_length = *(size_type *)pcVar5;
        local_e8.key_._M_dataplus._M_p = *(pointer *)(pcVar5 + 8);
        absl::lts_20250127::StrAppend(&call_str,(AlphaNum *)&local_1c0,(AlphaNum *)&local_e8);
        sStack_2c0 = 2;
        b = (Descriptor *)0x501b6e;
      }
      local_1c0 = absl::lts_20250127::NullSafeStringView(");");
      absl::lts_20250127::StrAppend(&call_str,(AlphaNum *)&local_1c0);
    }
    else {
LAB_002165d9:
      if ((this[0xcb] == (anon_unknown_0)0x1) && (*(char *)&message->containing_type_ == '\x01')) {
        std::__cxx11::string::_M_assign((string *)&call_str);
      }
    }
    if (call_str._M_string_length != 0) {
      std::__cxx11::string::push_back((char)&call_str);
      if (bVar2) {
        local_1c0 = absl::lts_20250127::NullSafeStringView("if (::");
        local_e8.key_._M_dataplus._M_p = (pointer)0x6;
        if (this[0xca] != (anon_unknown_0)0x0) {
          local_e8.key_._M_dataplus._M_p = (pointer)0x10;
        }
        local_e8.key_._M_string_length = 0x43ee7f;
        if (this[0xca] != (anon_unknown_0)0x0) {
          local_e8.key_._M_string_length = 0x43ee86;
        }
        local_260 = absl::lts_20250127::NullSafeStringView("::internal::cpp::IsTrackingEnabled()) ")
        ;
        local_210.piece_._M_len = call_str._M_string_length;
        local_210.piece_._M_str = call_str._M_dataplus._M_p;
        b = (Descriptor *)&local_260;
        absl::lts_20250127::StrCat_abi_cxx11_
                  (&local_230,(lts_20250127 *)&local_1c0,(AlphaNum *)&local_e8,(AlphaNum *)b,
                   &local_210,d);
        std::__cxx11::string::operator=((string *)&call_str,(string *)&local_230);
        std::__cxx11::string::~string((string *)&local_230);
      }
    }
    local_260._M_str = "annotate_";
    local_260._M_len = 9;
    local_210.piece_._M_len = ((key_arg<std::basic_string_view<char>_> *)alt_annotation)->_M_len;
    local_210.piece_._M_str = ((key_arg<std::basic_string_view<char>_> *)alt_annotation)->_M_str;
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_1e0,(lts_20250127 *)&local_260,&local_210,(AlphaNum *)b);
    io::Printer::Sub::Sub<std::__cxx11::string&>(&local_e8,&local_1e0,&call_str);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,";",(allocator<char> *)&local_230);
    io::Printer::Sub::WithSuffix((Sub *)&local_1c0,&local_e8,&local_108);
    std::
    vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
    ::emplace_back<google::protobuf::io::Printer::Sub>(__return_storage_ptr__,(Sub *)&local_1c0);
    io::Printer::Sub::~Sub((Sub *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_108);
    io::Printer::Sub::~Sub(&local_e8);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::string::~string((string *)&call_str);
    alt_annotation =
         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)((long)alt_annotation + 0x60);
  } while( true );
}

Assistant:

std::vector<Sub> GenerateTrackerCalls(
    const Options& opts, const Descriptor* message,
    absl::optional<std::string> alt_annotation, absl::Span<const Call> calls) {
  bool enable_tracking = HasTracker(message, opts);
  const auto& forbidden =
      opts.field_listener_options.forbidden_field_listener_events;

  std::vector<Sub> subs;
  for (const auto& call : calls) {
    std::string call_str;
    if (enable_tracking && !call.suppressed && !forbidden.contains(call.var)) {
      absl::SubstituteAndAppend(&call_str, "$0.$1", kTracker, call.call);
      if (call.field_index.has_value()) {
        absl::SubstituteAndAppend(&call_str, "<$0>", *call.field_index);
      }
      absl::StrAppend(&call_str, "(");

      absl::string_view arg_sep = "";
      if (call.thiz.has_value()) {
        absl::StrAppend(&call_str, *call.thiz);
        arg_sep = ", ";
      }

      for (const auto& arg : call.args) {
        absl::StrAppend(&call_str, arg_sep, arg);
        arg_sep = ", ";
      }

      absl::StrAppend(&call_str, ");");
    } else if (opts.annotate_accessor && alt_annotation.has_value()) {
      call_str = *alt_annotation;
    }

    if (!call_str.empty()) {
      // TODO: Until we migrate all of the C++ backend to use
      // Emit(), we need to include a newline here so that the line that follows
      // the annotation is on its own line.
      call_str.push_back('\n');
      if (enable_tracking) {
        call_str =
            absl::StrCat("if (::", ProtobufNamespace(opts),
                         "::internal::cpp::IsTrackingEnabled()) ", call_str);
      }
    }

    subs.push_back(
        Sub(absl::StrCat(kVarPrefix, call.var), call_str).WithSuffix(";"));
  }

  return subs;
}